

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>::
visit<slang::syntax::TypedefDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter> *this,
          TypedefDeclarationSyntax *t)

{
  Token *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *ptVar1;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
  *arrays_;
  undefined4 uVar2;
  iterator iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  Symbol *pSVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 pos0;
  SyntaxNode *pSVar7;
  ulong uVar8;
  logic_error *this_01;
  value_type *elements;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong hash;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  string_view sVar19;
  string_view fmt;
  string_view fmt_00;
  StringRef macroName;
  string_view text;
  StringRef capturedExpression;
  format_args args;
  format_args args_00;
  locator res_2;
  AssertionHandler catchAssertionHandler;
  EnumType *type;
  try_emplace_args_t local_121;
  TypedefDeclarationSyntax *local_120;
  undefined1 local_118 [32];
  Token *local_f8;
  ulong local_f0;
  AssertionHandler local_e8;
  ulong local_a0;
  SyntaxNode *local_98;
  Symbol *local_90;
  char local_88;
  char cStack_87;
  char cStack_86;
  byte bStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  byte bStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  byte bStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  byte bStack_79;
  char local_78;
  char cStack_77;
  char cStack_76;
  byte bStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  byte bStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  byte bStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  byte bStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  ITransientExpression local_48;
  Symbol **local_38;
  
  pSVar7 = (SyntaxNode *)(t->type).ptr;
  if (pSVar7->kind == EnumType) {
    local_90 = SemanticModel::getDeclaredSymbol((SemanticModel *)(this + 0xd80),pSVar7);
    local_118._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/VisitorTests.cpp"
    ;
    local_118._8_8_ = 0x1b0;
    macroName.m_size = 7;
    macroName.m_start = "REQUIRE";
    capturedExpression.m_size = 4;
    capturedExpression.m_start = "type";
    aVar12 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x4;
    Catch::AssertionHandler::AssertionHandler
              (&local_e8,macroName,(SourceLineInfo *)local_118,capturedExpression,Normal);
    local_48.m_result = local_90 != (Symbol *)0x0;
    local_48.m_isBinaryExpression = false;
    local_48._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8ca08;
    local_38 = &local_90;
    Catch::AssertionHandler::handleExpr(&local_e8,&local_48);
    Catch::AssertionHandler::complete(&local_e8);
    if (local_e8.m_completed == false) {
      (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
    pSVar6 = local_90;
    if (*(int *)&local_90[1].originatingSyntax != 0) {
      ast::Scope::elaborate((Scope *)&local_90[1].name._M_str);
    }
    pcVar14 = (char *)0x0;
    for (pSVar6 = pSVar6[1].nextInScope; pSVar6 != (Symbol *)0x0; pSVar6 = pSVar6->nextInScope) {
      pcVar14 = pcVar14 + 1;
    }
    this_00 = &t->name;
    sVar19 = parsing::Token::valueText(this_00);
    local_e8.m_assertionInfo.macroName.m_start = sVar19._M_str;
    local_e8.m_assertionInfo.macroName.m_size = sVar19._M_len;
    fmt.size_ = 0x4d;
    fmt.data_ = (char *)0x24;
    args.field_1.args_ = aVar12.args_;
    args.desc_ = (unsigned_long_long)&local_e8;
    local_e8.m_assertionInfo.lineInfo.file = pcVar14;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_118,(v11 *)"\n    localparam int {}__count1 = {};",fmt,args);
    sVar19._M_str = (char *)local_118._0_8_;
    sVar19._M_len = local_118._8_8_;
    local_98 = SyntaxRewriter<InterleavedRewriter>::parse
                         ((SyntaxRewriter<InterleavedRewriter> *)this,sVar19);
    local_f8 = this_00;
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    ptVar1 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
              *)(this + 0x20);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = t;
    hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0.values_ = (value<fmt::v11::context> *)(hash >> ((byte)this[0x20] & 0x3f));
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_f0 = (ulong)((uint)hash & 7);
    local_a0 = *(ulong *)(this + 0x28);
    uVar10 = 0;
    local_88 = (char)uVar2;
    cStack_87 = (char)((uint)uVar2 >> 8);
    cStack_86 = (char)((uint)uVar2 >> 0x10);
    bStack_85 = (byte)((uint)uVar2 >> 0x18);
    aVar12.values_ = pos0.values_;
    do {
      pcVar15 = (char *)(*(long *)(this + 0x30) + (long)aVar12.values_ * 0x10);
      local_58 = *pcVar15;
      cStack_57 = pcVar15[1];
      cStack_56 = pcVar15[2];
      bStack_55 = pcVar15[3];
      cStack_54 = pcVar15[4];
      cStack_53 = pcVar15[5];
      cStack_52 = pcVar15[6];
      bStack_51 = pcVar15[7];
      cStack_50 = pcVar15[8];
      cStack_4f = pcVar15[9];
      cStack_4e = pcVar15[10];
      bStack_4d = pcVar15[0xb];
      cStack_4c = pcVar15[0xc];
      cStack_4b = pcVar15[0xd];
      cStack_4a = pcVar15[0xe];
      bStack_49 = pcVar15[0xf];
      auVar16[0] = -(local_58 == local_88);
      auVar16[1] = -(cStack_57 == cStack_87);
      auVar16[2] = -(cStack_56 == cStack_86);
      auVar16[3] = -(bStack_55 == bStack_85);
      auVar16[4] = -(cStack_54 == local_88);
      auVar16[5] = -(cStack_53 == cStack_87);
      auVar16[6] = -(cStack_52 == cStack_86);
      auVar16[7] = -(bStack_51 == bStack_85);
      auVar16[8] = -(cStack_50 == local_88);
      auVar16[9] = -(cStack_4f == cStack_87);
      auVar16[10] = -(cStack_4e == cStack_86);
      auVar16[0xb] = -(bStack_4d == bStack_85);
      auVar16[0xc] = -(cStack_4c == local_88);
      auVar16[0xd] = -(cStack_4b == cStack_87);
      auVar16[0xe] = -(cStack_4a == cStack_86);
      auVar16[0xf] = -(bStack_49 == bStack_85);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
      local_118._0_8_ = t;
      cStack_84 = local_88;
      cStack_83 = cStack_87;
      cStack_82 = cStack_86;
      bStack_81 = bStack_85;
      cStack_80 = local_88;
      cStack_7f = cStack_87;
      cStack_7e = cStack_86;
      bStack_7d = bStack_85;
      cStack_7c = local_88;
      cStack_7b = cStack_87;
      cStack_7a = cStack_86;
      bStack_79 = bStack_85;
      if (uVar9 != 0) {
        lVar11 = *(long *)(this + 0x38) + (long)aVar12.values_ * 0x1e0;
        do {
          iVar4 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
            }
          }
          if (*(TypedefDeclarationSyntax **)(lVar11 + (ulong)(uint)(iVar4 << 5)) == t) {
            pcVar15 = (char *)(lVar11 + (ulong)(uint)(iVar4 << 5));
            goto LAB_0047d961;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_f0] & bStack_49) == 0) break;
      lVar11 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      aVar12.values_ =
           (value<fmt::v11::context> *)
           ((ulong)((long)&(aVar12.values_)->field_0 + lVar11) & local_a0);
    } while (uVar10 <= local_a0);
    if (*(ulong *)(this + 0x48) < *(ulong *)(this + 0x40)) {
      aVar12.values_ = (value<fmt::v11::context> *)&local_120;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_e8,ptVar1,(arrays_type *)ptVar1,(size_t)pos0,hash,
                 (try_emplace_args_t *)aVar12.values_,(SyntaxNode **)local_118);
      *(long *)(this + 0x48) = *(long *)(this + 0x48) + 1;
      pcVar15 = local_e8.m_assertionInfo.lineInfo.file;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_e8,ptVar1,hash,(try_emplace_args_t *)&local_120,
                 (SyntaxNode **)local_118);
      pcVar15 = local_e8.m_assertionInfo.lineInfo.file;
    }
LAB_0047d961:
    local_e8.m_assertionInfo.macroName.m_size = (size_type)local_98;
    local_e8.m_assertionInfo.macroName.m_start = (char *)t;
    parsing::Token::Token((Token *)&local_e8.m_assertionInfo.lineInfo);
    iVar3._M_current = *(SyntaxChange **)(pcVar15 + 0x10);
    if (iVar3._M_current == *(SyntaxChange **)(pcVar15 + 0x18)) {
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                ((vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                  *)(pcVar15 + 8),iVar3,(SyntaxChange *)&local_e8);
    }
    else {
      *(char **)&(iVar3._M_current)->separator = local_e8.m_assertionInfo.lineInfo.file;
      ((iVar3._M_current)->separator).info = (Info *)local_e8.m_assertionInfo.lineInfo.line;
      (iVar3._M_current)->first = (SyntaxNode *)local_e8.m_assertionInfo.macroName.m_start;
      (iVar3._M_current)->second = (SyntaxNode *)local_e8.m_assertionInfo.macroName.m_size;
      *(long *)(pcVar15 + 0x10) = *(long *)(pcVar15 + 0x10) + 0x20;
    }
    sVar19 = parsing::Token::valueText(local_f8);
    local_e8.m_assertionInfo.macroName.m_start = sVar19._M_str;
    local_e8.m_assertionInfo.macroName.m_size = sVar19._M_len;
    fmt_00.size_ = 0x4d;
    fmt_00.data_ = (char *)0x24;
    args_00.field_1.values_ = aVar12.values_;
    args_00.desc_ = (unsigned_long_long)&local_e8;
    local_e8.m_assertionInfo.lineInfo.file = pcVar14;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_118,(v11 *)"\n    localparam int {}__count2 = {};",fmt_00,args_00);
    text._M_str = (char *)local_118._0_8_;
    text._M_len = local_118._8_8_;
    pSVar7 = SyntaxRewriter<InterleavedRewriter>::parse
                       ((SyntaxRewriter<InterleavedRewriter> *)this,text);
    if ((TypedefDeclarationSyntax *)local_118._0_8_ !=
        (TypedefDeclarationSyntax *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    ptVar1 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
              *)(this + 0x50);
    uVar8 = hash >> ((byte)this[0x50] & 0x3f);
    local_f8 = *(Token **)(this + 0x58);
    uVar10 = 0;
    uVar13 = uVar8;
    do {
      pcVar14 = (char *)(*(long *)(this + 0x60) + uVar13 * 0x10);
      local_68 = *pcVar14;
      cStack_67 = pcVar14[1];
      cStack_66 = pcVar14[2];
      bStack_65 = pcVar14[3];
      cStack_64 = pcVar14[4];
      cStack_63 = pcVar14[5];
      cStack_62 = pcVar14[6];
      bStack_61 = pcVar14[7];
      cStack_60 = pcVar14[8];
      cStack_5f = pcVar14[9];
      cStack_5e = pcVar14[10];
      bStack_5d = pcVar14[0xb];
      cStack_5c = pcVar14[0xc];
      cStack_5b = pcVar14[0xd];
      cStack_5a = pcVar14[0xe];
      bStack_59 = pcVar14[0xf];
      auVar17[0] = -(local_68 == local_88);
      auVar17[1] = -(cStack_67 == cStack_87);
      auVar17[2] = -(cStack_66 == cStack_86);
      auVar17[3] = -(bStack_65 == bStack_85);
      auVar17[4] = -(cStack_64 == cStack_84);
      auVar17[5] = -(cStack_63 == cStack_83);
      auVar17[6] = -(cStack_62 == cStack_82);
      auVar17[7] = -(bStack_61 == bStack_81);
      auVar17[8] = -(cStack_60 == cStack_80);
      auVar17[9] = -(cStack_5f == cStack_7f);
      auVar17[10] = -(cStack_5e == cStack_7e);
      auVar17[0xb] = -(bStack_5d == bStack_7d);
      auVar17[0xc] = -(cStack_5c == cStack_7c);
      auVar17[0xd] = -(cStack_5b == cStack_7b);
      auVar17[0xe] = -(cStack_5a == cStack_7a);
      auVar17[0xf] = -(bStack_59 == bStack_79);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        lVar11 = *(long *)(this + 0x68) + uVar13 * 0x1e0;
        do {
          iVar4 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
            }
          }
          if (*(TypedefDeclarationSyntax **)(lVar11 + (ulong)(uint)(iVar4 << 5)) == t) {
            pcVar14 = (char *)(lVar11 + (ulong)(uint)(iVar4 << 5));
            local_118._0_8_ = t;
            goto LAB_0047db0b;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_f0] & bStack_59) == 0) break;
      lVar11 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      uVar13 = lVar11 + uVar13 & (ulong)local_f8;
    } while (uVar10 <= local_f8);
    if (*(ulong *)(this + 0x78) < *(ulong *)(this + 0x70)) {
      local_118._0_8_ = t;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_e8,ptVar1,(arrays_type *)ptVar1,uVar8,hash,
                 (try_emplace_args_t *)&local_120,(SyntaxNode **)local_118);
      *(long *)(this + 0x78) = *(long *)(this + 0x78) + 1;
      pcVar14 = local_e8.m_assertionInfo.lineInfo.file;
    }
    else {
      local_118._0_8_ = t;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&local_e8,ptVar1,hash,(try_emplace_args_t *)&local_120,
                 (SyntaxNode **)local_118);
      pcVar14 = local_e8.m_assertionInfo.lineInfo.file;
    }
LAB_0047db0b:
    local_e8.m_assertionInfo.macroName.m_start = (char *)t;
    local_e8.m_assertionInfo.macroName.m_size = (size_type)pSVar7;
    parsing::Token::Token((Token *)&local_e8.m_assertionInfo.lineInfo);
    iVar3._M_current = *(SyntaxChange **)(pcVar14 + 0x10);
    if (iVar3._M_current == *(SyntaxChange **)(pcVar14 + 0x18)) {
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                ((vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                  *)(pcVar14 + 8),iVar3,(SyntaxChange *)&local_e8);
    }
    else {
      *(char **)&(iVar3._M_current)->separator = local_e8.m_assertionInfo.lineInfo.file;
      ((iVar3._M_current)->separator).info = (Info *)local_e8.m_assertionInfo.lineInfo.line;
      (iVar3._M_current)->first = (SyntaxNode *)local_e8.m_assertionInfo.macroName.m_start;
      (iVar3._M_current)->second = (SyntaxNode *)local_e8.m_assertionInfo.macroName.m_size;
      *(long *)(pcVar14 + 0x10) = *(long *)(pcVar14 + 0x10) + 0x20;
    }
    arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
               *)(this + 0x80);
    local_e8.m_assertionInfo.macroName.m_size = 0;
    local_120 = t;
    local_e8.m_assertionInfo.macroName.m_start = (char *)t;
    parsing::Token::Token((Token *)&local_e8.m_assertionInfo.lineInfo);
    uVar13 = hash >> ((byte)this[0x80] & 0x3f);
    uVar8 = 0;
    uVar10 = uVar13;
    do {
      pcVar14 = (char *)(*(long *)(this + 0x90) + uVar10 * 0x10);
      local_78 = *pcVar14;
      cStack_77 = pcVar14[1];
      cStack_76 = pcVar14[2];
      bStack_75 = pcVar14[3];
      cStack_74 = pcVar14[4];
      cStack_73 = pcVar14[5];
      cStack_72 = pcVar14[6];
      bStack_71 = pcVar14[7];
      cStack_70 = pcVar14[8];
      cStack_6f = pcVar14[9];
      cStack_6e = pcVar14[10];
      bStack_6d = pcVar14[0xb];
      cStack_6c = pcVar14[0xc];
      cStack_6b = pcVar14[0xd];
      cStack_6a = pcVar14[0xe];
      bStack_69 = pcVar14[0xf];
      auVar18[0] = -(local_78 == local_88);
      auVar18[1] = -(cStack_77 == cStack_87);
      auVar18[2] = -(cStack_76 == cStack_86);
      auVar18[3] = -(bStack_75 == bStack_85);
      auVar18[4] = -(cStack_74 == cStack_84);
      auVar18[5] = -(cStack_73 == cStack_83);
      auVar18[6] = -(cStack_72 == cStack_82);
      auVar18[7] = -(bStack_71 == bStack_81);
      auVar18[8] = -(cStack_70 == cStack_80);
      auVar18[9] = -(cStack_6f == cStack_7f);
      auVar18[10] = -(cStack_6e == cStack_7e);
      auVar18[0xb] = -(bStack_6d == bStack_7d);
      auVar18[0xc] = -(cStack_6c == cStack_7c);
      auVar18[0xd] = -(cStack_6b == cStack_7b);
      auVar18[0xe] = -(cStack_6a == cStack_7a);
      auVar18[0xf] = -(bStack_69 == bStack_79);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        do {
          iVar4 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
            }
          }
          if (*(TypedefDeclarationSyntax **)
               (*(long *)(this + 0x98) + uVar10 * 0x2d0 + (ulong)(uint)(iVar4 * 0x30)) == t) {
            this_01 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_01,"Node only permit one remove/replace operation");
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_f0] & bStack_69) == 0) break;
      lVar11 = uVar10 + uVar8;
      uVar8 = uVar8 + 1;
      uVar10 = lVar11 + 1U & *(ulong *)(this + 0x88);
    } while (uVar8 <= *(ulong *)(this + 0x88));
    if (*(ulong *)(this + 0xa8) < *(ulong *)(this + 0xa0)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,slang::syntax::detail::RemoveChange>
                ((locator *)local_118,arrays_,(arrays_type *)arrays_,uVar13,hash,&local_121,
                 (SyntaxNode **)&local_120,(RemoveChange *)&local_e8);
      *(long *)(this + 0xa8) = *(long *)(this + 0xa8) + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::variant<slang::syntax::detail::RemoveChange,slang::syntax::detail::ReplaceChange>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,slang::syntax::detail::RemoveChange>
                ((locator *)local_118,arrays_,hash,&local_121,(SyntaxNode **)&local_120,
                 (RemoveChange *)&local_e8);
    }
  }
  return;
}

Assistant:

void visit(T&& t) {
        if constexpr (requires { DERIVED->handle(t); })
            DERIVED->handle(t);
        else
            DERIVED->visitDefault(t);
    }